

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread.cpp
# Opt level: O0

thread_t embree::createThread(thread_func f,void *arg,size_t stack_size,ssize_t threadID)

{
  int iVar1;
  thread_t __newthread;
  ThreadStartupData *this;
  runtime_error *this_00;
  long in_RCX;
  size_t in_RDX;
  void *in_RSI;
  thread_func in_RDI;
  size_t __cpu;
  cpu_set_t cset;
  pthread_t *tid;
  pthread_attr_t attr;
  size_t in_stack_00000300;
  cpu_set_t local_f0;
  thread_t local_60;
  pthread_attr_t local_58;
  size_t local_20;
  size_t local_18;
  void *local_10;
  thread_func local_8;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  pthread_attr_init(&local_58);
  if (local_18 != 0) {
    pthread_attr_setstacksize(&local_58,local_18);
  }
  __newthread = (thread_t)::operator_new(8);
  local_60 = __newthread;
  this = (ThreadStartupData *)::operator_new(0x18);
  ThreadStartupData::ThreadStartupData(this,local_8,local_10,(int)local_20);
  iVar1 = pthread_create((pthread_t *)__newthread,&local_58,threadStartup,this);
  if (iVar1 == 0) {
    pthread_attr_destroy(&local_58);
    if (-1 < (long)local_20) {
      memset(&local_f0,0,0x80);
      local_20 = mapThreadID(in_stack_00000300);
      if (local_20 >> 3 < 0x80) {
        local_f0.__bits[local_20 >> 6] =
             1L << ((byte)local_20 & 0x3f) | local_f0.__bits[local_20 >> 6];
      }
      pthread_setaffinity_np(*(pthread_t *)local_60,0x80,&local_f0);
    }
    return local_60;
  }
  pthread_attr_destroy(&local_58);
  if (local_60 != (thread_t)0x0) {
    ::operator_delete(local_60);
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"pthread_create failed");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

thread_t createThread(thread_func f, void* arg, size_t stack_size, ssize_t threadID)
  {
    /* set stack size */
    pthread_attr_t attr;
    pthread_attr_init(&attr);
    if (stack_size > 0) pthread_attr_setstacksize (&attr, stack_size);

    /* create thread */
    pthread_t* tid = new pthread_t;
    if (pthread_create(tid,&attr,(void*(*)(void*))threadStartup,new ThreadStartupData(f,arg,threadID)) != 0) {
      pthread_attr_destroy(&attr);
      delete tid; 
      FATAL("pthread_create failed");
    }
    pthread_attr_destroy(&attr);

    /* set affinity */
#if defined(__LINUX__) && !defined(__ANDROID__)
    if (threadID >= 0) {
      cpu_set_t cset;
      CPU_ZERO(&cset);
      threadID = mapThreadID(threadID);
      CPU_SET(threadID, &cset);
      pthread_setaffinity_np(*tid, sizeof(cset), &cset);
    }
#elif defined(__FreeBSD__)
    if (threadID >= 0) {
      cpuset_t cset;
      CPU_ZERO(&cset);
      CPU_SET(threadID, &cset);
      pthread_setaffinity_np(*tid, sizeof(cset), &cset);
    }
#elif defined(__ANDROID__)
    if (threadID >= 0) {
      cpu_set_t cset;
      CPU_ZERO(&cset);
      CPU_SET(threadID, &cset);
      sched_setaffinity(pthread_gettid_np(*tid), sizeof(cset), &cset);
    }
#endif

    return thread_t(tid);
  }